

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

Gia_Obj_t * Gia_ManEquivRepr(Gia_Man_t *p,Gia_Obj_t *pObj,int fUseAll,int fDualOut)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int fDualOut_local;
  int fUseAll_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (fUseAll == 0) {
    iVar1 = Gia_ObjId(p,pObj);
    iVar1 = Gia_ObjProved(p,iVar1);
    if (iVar1 == 0) {
      return (Gia_Obj_t *)0x0;
    }
  }
  else {
    iVar1 = Gia_ObjId(p,pObj);
    iVar1 = Gia_ObjRepr(p,iVar1);
    if (iVar1 == 0xfffffff) {
      return (Gia_Obj_t *)0x0;
    }
  }
  if (fDualOut != 0) {
    iVar1 = Gia_ObjId(p,pObj);
    iVar2 = Gia_ObjId(p,pObj);
    iVar2 = Gia_ObjRepr(p,iVar2);
    iVar1 = Gia_ObjDiffColors2(p,iVar1,iVar2);
    if (iVar1 == 0) {
      return (Gia_Obj_t *)0x0;
    }
  }
  iVar1 = Gia_ObjId(p,pObj);
  iVar1 = Gia_ObjRepr(p,iVar1);
  pGVar3 = Gia_ManObj(p,iVar1);
  return pGVar3;
}

Assistant:

static inline Gia_Obj_t * Gia_ManEquivRepr( Gia_Man_t * p, Gia_Obj_t * pObj, int fUseAll, int fDualOut )
{
    if ( fUseAll )
    {
        if ( Gia_ObjRepr(p, Gia_ObjId(p,pObj)) == GIA_VOID )
            return NULL;
    }
    else
    {
        if ( !Gia_ObjProved(p, Gia_ObjId(p,pObj)) )
            return NULL;
    }
//    if ( fDualOut && !Gia_ObjDiffColors( p, Gia_ObjId(p, pObj), Gia_ObjRepr(p, Gia_ObjId(p,pObj)) ) )
    if ( fDualOut && !Gia_ObjDiffColors2( p, Gia_ObjId(p, pObj), Gia_ObjRepr(p, Gia_ObjId(p,pObj)) ) )
        return NULL;
    return Gia_ManObj( p, Gia_ObjRepr(p, Gia_ObjId(p,pObj)) );
}